

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  _func_int **pp_Var4;
  QArrayData *pQVar5;
  int *piVar6;
  QArrayData *pQVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Data *pDVar14;
  char16_t *pcVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  char cVar20;
  triState tVar21;
  XmlOutput *pXVar22;
  iterator iVar23;
  XmlOutput *pXVar24;
  ssize_t extraout_RAX;
  char *pcVar25;
  undefined4 in_register_00000034;
  storage_type *psVar26;
  long lVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QByteArrayView QVar74;
  QByteArrayView QVar75;
  QByteArrayView QVar76;
  QByteArrayView QVar77;
  QByteArrayView QVar78;
  QByteArrayView QVar79;
  QByteArrayView QVar80;
  QByteArrayView QVar81;
  QByteArrayView QVar82;
  QByteArrayView QVar83;
  QByteArrayView QVar84;
  QByteArrayView QVar85;
  QByteArrayView QVar86;
  QByteArrayView QVar87;
  QByteArrayView QVar88;
  QByteArrayView QVar89;
  QByteArrayView QVar90;
  QByteArrayView QVar91;
  QByteArrayView QVar92;
  QByteArrayView QVar93;
  QByteArrayView QVar94;
  QByteArrayView QVar95;
  QByteArrayView QVar96;
  QByteArrayView QVar97;
  QByteArrayView QVar98;
  QByteArrayView QVar99;
  QByteArrayView QVar100;
  QByteArrayView QVar101;
  QByteArrayView QVar102;
  QByteArrayView QVar103;
  QByteArrayView QVar104;
  QByteArrayView QVar105;
  QByteArrayView QVar106;
  QByteArrayView QVar107;
  QByteArrayView QVar108;
  QByteArrayView QVar109;
  QByteArrayView QVar110;
  QByteArrayView QVar111;
  QByteArrayView QVar112;
  QByteArrayView QVar113;
  QByteArrayView QVar114;
  QByteArrayView QVar115;
  QByteArrayView QVar116;
  QByteArrayView QVar117;
  QByteArrayView QVar118;
  QByteArrayView QVar119;
  QByteArrayView QVar120;
  QByteArrayView QVar121;
  QByteArrayView QVar122;
  QByteArrayView QVar123;
  QByteArrayView QVar124;
  QByteArrayView QVar125;
  QByteArrayView QVar126;
  QByteArrayView QVar127;
  QByteArrayView QVar128;
  QByteArrayView QVar129;
  QByteArrayView QVar130;
  XmlOutput xmlFilter;
  undefined1 local_208 [64];
  undefined1 *local_1c8;
  Data *pDStack_1c0;
  QString *local_1b8;
  undefined1 *puStack_1b0;
  xml_output local_1a8;
  xml_output local_168;
  xml_output local_128;
  xml_output local_f0;
  xml_output local_b8;
  xml_output local_78;
  long local_38;
  
  pXVar24 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x100) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      warn_msg(WarnLogic,"Generator: .NET: no single project in merge project, no output");
      return extraout_RAX;
    }
  }
  else {
    QVar29.m_data = (storage_type *)0x2;
    QVar29.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar29);
    local_78._0_8_ = local_208._0_8_;
    local_78.xo_text.d.d = (Data *)local_208._8_8_;
    local_78.xo_text.d.ptr = (char16_t *)local_208._16_8_;
    XmlOutput::setIndentString(pXVar24,(QString *)&local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    QVar30.m_data = (storage_type *)0x3;
    QVar30.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar30);
    uVar11 = local_208._16_8_;
    uVar10 = local_208._8_8_;
    uVar8 = local_208._0_8_;
    QVar31.m_data = (storage_type *)0x5;
    QVar31.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar31);
    local_208._48_8_ = local_208._16_8_;
    local_208._40_8_ = local_208._8_8_;
    uVar9 = local_208._0_8_;
    local_208._0_4_ = tDeclaration;
    local_208._8_8_ = uVar8;
    local_208._16_8_ = uVar10;
    local_208._24_8_ = uVar11;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208._32_8_ = uVar9;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    QVar32.m_data = (storage_type *)0x7;
    QVar32.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar32);
    local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
    local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
    uVar10 = local_78._0_8_;
    local_78.xo_type = 3;
    local_78.xo_text.d.d = (Data *)uVar10;
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.xo_value.d.d = (Data *)0x0;
    local_78.xo_value.d.ptr = (char16_t *)0x0;
    local_78.xo_value.d.size = 0;
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
    QVar33.m_data = (storage_type *)0xe;
    QVar33.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar33);
    pcVar15 = local_b8.xo_text.d.ptr;
    pDVar14 = local_b8.xo_text.d.d;
    uVar11 = local_b8._0_8_;
    QVar34.m_data = (storage_type *)0x5;
    QVar34.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar34);
    local_b8.xo_value.d.size = (qsizetype)local_b8.xo_text.d.ptr;
    local_b8.xo_value.d.ptr = (char16_t *)local_b8.xo_text.d.d;
    uVar17 = local_b8._0_8_;
    local_b8.xo_type = 8;
    local_b8.xo_text.d.d = (Data *)uVar11;
    local_b8.xo_text.d.ptr = (char16_t *)pDVar14;
    local_b8.xo_text.d.size = (qsizetype)pcVar15;
    if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b8.xo_value.d.d = (Data *)uVar17;
    if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_b8);
    iVar23 = QList<VCProjectSingleConfig>::begin
                       ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0));
    attrTagToolsVersion(&local_f0,&(iVar23.i)->Configuration);
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_f0);
    QVar35.m_data = (storage_type *)0x5;
    QVar35.m_size = (qsizetype)&local_128;
    QString::fromUtf8(QVar35);
    pcVar15 = local_128.xo_text.d.ptr;
    pDVar14 = local_128.xo_text.d.d;
    uVar18 = local_128._0_8_;
    QVar36.m_data = (storage_type *)0x33;
    QVar36.m_size = (qsizetype)&local_128;
    QString::fromUtf8(QVar36);
    local_128.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
    local_128.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
    uVar19 = local_128._0_8_;
    local_128.xo_type = 8;
    local_128.xo_text.d.d = (Data *)uVar18;
    local_128.xo_text.d.ptr = (char16_t *)pDVar14;
    local_128.xo_text.d.size = (qsizetype)pcVar15;
    if ((QArrayData *)uVar18 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar18)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar18)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.xo_value.d.d = (Data *)uVar19;
    if ((QArrayData *)uVar19 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar19)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar19)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_128);
    QVar37.m_data = (storage_type *)0x9;
    QVar37.m_size = (qsizetype)&local_168;
    QString::fromUtf8(QVar37);
    local_168.xo_text.d.size = (qsizetype)local_168.xo_text.d.ptr;
    local_168.xo_text.d.ptr = (char16_t *)local_168.xo_text.d.d;
    uVar16 = local_168._0_8_;
    local_168.xo_type = 3;
    local_168.xo_text.d.d = (Data *)uVar16;
    if ((QArrayData *)uVar16 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_168.xo_value.d.d = (Data *)0x0;
    local_168.xo_value.d.ptr = (char16_t *)0x0;
    local_168.xo_value.d.size = 0;
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_168);
    QVar38.m_data = (storage_type *)0x5;
    QVar38.m_size = (qsizetype)&local_1a8;
    QString::fromUtf8(QVar38);
    pcVar15 = local_1a8.xo_text.d.ptr;
    pDVar14 = local_1a8.xo_text.d.d;
    uVar12 = local_1a8._0_8_;
    QVar39.m_data = (storage_type *)0x15;
    QVar39.m_size = (qsizetype)&local_1a8;
    QString::fromUtf8(QVar39);
    local_1a8.xo_value.d.size = (qsizetype)local_1a8.xo_text.d.ptr;
    local_1a8.xo_value.d.ptr = (char16_t *)local_1a8.xo_text.d.d;
    uVar13 = local_1a8._0_8_;
    local_1a8.xo_type = 8;
    local_1a8.xo_text.d.d = (Data *)uVar12;
    local_1a8.xo_text.d.ptr = (char16_t *)pDVar14;
    local_1a8.xo_text.d.size = (qsizetype)pcVar15;
    if ((QArrayData *)uVar12 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.xo_value.d.d = (Data *)uVar13;
    if ((QArrayData *)uVar13 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    XmlOutput::operator<<(pXVar22,&local_1a8);
    if (&(local_1a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_1a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_1a8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_1a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_1a8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar13 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar13,2,0x10);
      }
    }
    if ((QArrayData *)uVar12 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar12,2,0x10);
      }
    }
    if (&(local_168.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_168.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_168.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_168.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_168.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar16 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar16)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar16,2,0x10);
      }
    }
    if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar19 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar19)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar19)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar19)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar19,2,0x10);
      }
    }
    if ((QArrayData *)uVar18 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar18)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar18)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar18)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar18,2,0x10);
      }
    }
    if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar17,2,0x10);
      }
    }
    if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
      }
    }
    if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
      }
    }
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if (*(long *)((long)__buf + 0x100) != 0) {
      lVar27 = 0;
      uVar28 = 0;
      do {
        QVar40.m_data = (storage_type *)0x14;
        QVar40.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar40);
        uVar8 = local_78._0_8_;
        local_208._0_4_ = tTag;
        local_208._8_8_ = local_78._0_8_;
        local_208._16_8_ = local_78.xo_text.d.d;
        local_208._24_8_ = local_78.xo_text.d.ptr;
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_208._32_8_ = (QArrayData *)0x0;
        local_208._40_8_ = (QArrayData *)0x0;
        local_208._48_8_ = (QArrayData *)0x0;
        pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
        QVar41.m_data = (storage_type *)0x7;
        QVar41.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar41);
        local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
        local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
        uVar9 = local_78._0_8_;
        lVar3 = *(long *)((long)__buf + 0xf8);
        local_78.xo_type = 8;
        local_78.xo_text.d.d = (Data *)uVar9;
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78.xo_value.d.d = *(Data **)(lVar3 + 0x120 + lVar27);
        local_78.xo_value.d.ptr = *(char16_t **)(lVar3 + 0x128 + lVar27);
        local_78.xo_value.d.size = *(qsizetype *)(lVar3 + 0x130 + lVar27);
        if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
        QVar42.m_data = (storage_type *)0xd;
        QVar42.m_size = (qsizetype)&local_b8;
        QString::fromUtf8(QVar42);
        local_b8.xo_text.d.size = (qsizetype)local_b8.xo_text.d.ptr;
        local_b8.xo_text.d.ptr = (char16_t *)local_b8.xo_text.d.d;
        uVar10 = local_b8._0_8_;
        lVar3 = *(long *)((long)__buf + 0xf8);
        local_b8.xo_type = 4;
        local_b8.xo_text.d.d = (Data *)uVar10;
        if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_b8.xo_value.d.d = *(Data **)(lVar3 + 0x138 + lVar27);
        local_b8.xo_value.d.ptr = *(char16_t **)(lVar3 + 0x140 + lVar27);
        local_b8.xo_value.d.size = *(undefined8 *)(lVar3 + 0x148 + lVar27);
        if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_b8);
        QVar43.m_data = &DAT_00000008;
        QVar43.m_size = (qsizetype)&local_f0;
        QString::fromUtf8(QVar43);
        local_f0.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
        pQVar5 = (QArrayData *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
        lVar3 = *(long *)((long)__buf + 0xf8);
        local_f0.xo_type = tTagValue;
        local_f0.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_f0.xo_value.d.d = *(Data **)(lVar3 + 0x90 + lVar27);
        local_f0.xo_value.d.ptr = *(char16_t **)(lVar3 + 0x98 + lVar27);
        local_f0.xo_value.d.size = *(undefined8 *)(lVar3 + 0xa0 + lVar27);
        if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_f0.xo_text.d.d = (Data *)pQVar5;
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_f0);
        local_128.xo_type = 6;
        local_128.xo_value.d.ptr = (char16_t *)0x0;
        local_128.xo_value.d.size = 0;
        local_128.xo_text.d.size = 0;
        local_128.xo_value.d.d = (Data *)0x0;
        local_128.xo_text.d.d = (Data *)0x0;
        local_128.xo_text.d.ptr = (char16_t *)0x0;
        XmlOutput::operator<<(pXVar22,&local_128);
        if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
          }
        }
        if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
          }
        }
        if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
          }
        }
        if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
          }
        }
        if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
          }
        }
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + 0x3a10;
      } while (uVar28 < *(ulong *)((long)__buf + 0x100));
    }
    local_208._0_4_ = 6;
    local_208._8_8_ = (QArrayData *)0x0;
    local_208._16_8_ = (QArrayData *)0x0;
    local_208._24_8_ = (QArrayData *)0x0;
    local_208._32_8_ = (QArrayData *)0x0;
    local_208._40_8_ = (char16_t *)0x0;
    local_208._48_8_ = 0;
    pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    QVar44.m_data = (storage_type *)0xd;
    QVar44.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar44);
    local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
    local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
    uVar8 = local_78._0_8_;
    local_78.xo_type = 3;
    local_78.xo_text.d.d = (Data *)uVar8;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.xo_value.d.d = (Data *)0x0;
    local_78.xo_value.d.ptr = (char16_t *)0x0;
    local_78.xo_value.d.size = 0;
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
    QVar45.m_data = (storage_type *)0x5;
    QVar45.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar45);
    pcVar15 = local_b8.xo_text.d.ptr;
    pDVar14 = local_b8.xo_text.d.d;
    uVar9 = local_b8._0_8_;
    QVar46.m_data = (storage_type *)0x7;
    QVar46.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar46);
    local_b8.xo_value.d.size = (qsizetype)local_b8.xo_text.d.ptr;
    local_b8.xo_value.d.ptr = (char16_t *)local_b8.xo_text.d.d;
    uVar10 = local_b8._0_8_;
    local_b8.xo_type = tAttributeTag;
    local_b8.xo_text.d.d = (Data *)uVar9;
    local_b8.xo_text.d.ptr = (char16_t *)pDVar14;
    local_b8.xo_text.d.size = (qsizetype)pcVar15;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b8.xo_value.d.d = (Data *)uVar10;
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_b8);
    QVar47.m_data = (storage_type *)0xb;
    QVar47.m_size = (qsizetype)&local_f0;
    QString::fromUtf8(QVar47);
    local_f0.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
    pQVar5 = (QArrayData *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
    local_f0.xo_type = tTagValue;
    local_f0.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_f0.xo_value.d.d = *(Data **)((long)__buf + 0x30);
    local_f0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x38);
    local_f0.xo_value.d.size = *(undefined8 *)((long)__buf + 0x40);
    if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_f0.xo_text.d.d = (Data *)pQVar5;
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_f0);
    QVar48.m_data = (storage_type *)0xd;
    QVar48.m_size = (qsizetype)&local_128;
    QString::fromUtf8(QVar48);
    local_128.xo_text.d.size = (qsizetype)local_128.xo_text.d.ptr;
    local_128.xo_text.d.ptr = (char16_t *)local_128.xo_text.d.d;
    uVar11 = local_128._0_8_;
    local_128.xo_type = 4;
    local_128.xo_text.d.d = (Data *)uVar11;
    if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.xo_value.d.d = *__buf;
    local_128.xo_value.d.ptr = *(char16_t **)((long)__buf + 8);
    local_128.xo_value.d.size = *(qsizetype *)((long)__buf + 0x10);
    if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_128);
    QVar49.m_data = (storage_type *)0x7;
    QVar49.m_size = (qsizetype)&local_168;
    QString::fromUtf8(QVar49);
    local_168.xo_text.d.size = (qsizetype)local_168.xo_text.d.ptr;
    local_168.xo_text.d.ptr = (char16_t *)local_168.xo_text.d.d;
    uVar17 = local_168._0_8_;
    local_168.xo_type = tTagValue;
    local_168.xo_text.d.d = (Data *)uVar17;
    if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_168.xo_value.d.d = *(Data **)((long)__buf + 0x48);
    local_168.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x50);
    local_168.xo_value.d.size = *(qsizetype *)((long)__buf + 0x58);
    if (&(local_168.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    XmlOutput::operator<<(pXVar22,&local_168);
    if (&(local_168.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_168.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_168.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_168.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_168.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_168.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar17,2,0x10);
      }
    }
    if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
      }
    }
    if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if (*(long *)((long)__buf + 0xd0) != 0) {
      QVar50.m_data = (storage_type *)0x1c;
      QVar50.m_size = (qsizetype)local_208;
      QString::fromUtf8(QVar50);
      local_208._24_8_ = local_208._16_8_;
      local_208._16_8_ = local_208._8_8_;
      uVar8 = local_208._0_8_;
      local_208._0_4_ = 4;
      local_208._8_8_ = uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_208._32_8_ = *(long *)((long)__buf + 0xc0);
      local_208._40_8_ = *(undefined8 *)((long)__buf + 200);
      local_208._48_8_ = *(qsizetype *)((long)__buf + 0xd0);
      if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_208._32_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_208._32_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
      if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
    }
    if (*(long *)((long)__buf + 0xe8) != 0) {
      QVar51.m_data = (storage_type *)0x1f;
      QVar51.m_size = (qsizetype)local_208;
      QString::fromUtf8(QVar51);
      local_208._24_8_ = local_208._16_8_;
      local_208._16_8_ = local_208._8_8_;
      uVar8 = local_208._0_8_;
      local_208._0_4_ = 4;
      local_208._8_8_ = uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_208._32_8_ = *(long *)((long)__buf + 0xd8);
      local_208._40_8_ = *(undefined8 *)((long)__buf + 0xe0);
      local_208._48_8_ = *(qsizetype *)((long)__buf + 0xe8);
      if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_208._32_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_208._32_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
      if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
    }
    local_208._0_4_ = 6;
    local_208._8_8_ = (QArrayData *)0x0;
    local_208._16_8_ = (char16_t *)0x0;
    local_208._24_8_ = 0;
    local_208._32_8_ = (QArrayData *)0x0;
    local_208._40_8_ = (char16_t *)0x0;
    local_208._48_8_ = 0;
    XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    QVar52.m_data = (storage_type *)0x7;
    QVar52.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar52);
    uVar11 = local_208._16_8_;
    uVar10 = local_208._8_8_;
    uVar8 = local_208._0_8_;
    QVar53.m_data = (storage_type *)0x2c;
    QVar53.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar53);
    local_208._48_8_ = local_208._16_8_;
    local_208._40_8_ = local_208._8_8_;
    uVar9 = local_208._0_8_;
    local_208._0_4_ = 10;
    local_208._8_8_ = uVar8;
    local_208._16_8_ = uVar10;
    local_208._24_8_ = uVar11;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208._32_8_ = uVar9;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if (*(long *)((long)__buf + 0x100) != 0) {
      lVar27 = 0xc0;
      uVar28 = 0;
      do {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xe])
                  (this,pXVar24,*(long *)((long)__buf + 0xf8) + lVar27);
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + 0x3a10;
      } while (uVar28 < *(ulong *)((long)__buf + 0x100));
    }
    QVar54.m_data = (storage_type *)0x7;
    QVar54.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar54);
    uVar11 = local_208._16_8_;
    uVar10 = local_208._8_8_;
    uVar8 = local_208._0_8_;
    QVar55.m_data = (storage_type *)0x24;
    QVar55.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar55);
    local_208._48_8_ = local_208._16_8_;
    local_208._40_8_ = local_208._8_8_;
    uVar9 = local_208._0_8_;
    local_208._0_4_ = 10;
    local_208._8_8_ = uVar8;
    local_208._16_8_ = uVar10;
    local_208._24_8_ = uVar11;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208._32_8_ = uVar9;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    QVar56.m_data = (storage_type *)0xb;
    QVar56.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar56);
    local_208._24_8_ = local_208._16_8_;
    local_208._16_8_ = local_208._8_8_;
    uVar8 = local_208._0_8_;
    local_208._0_4_ = 3;
    local_208._8_8_ = uVar8;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208._32_8_ = (QArrayData *)0x0;
    local_208._40_8_ = (char16_t *)0x0;
    local_208._48_8_ = 0;
    pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    QVar57.m_data = (storage_type *)0x5;
    QVar57.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar57);
    pcVar15 = local_78.xo_text.d.ptr;
    pDVar14 = local_78.xo_text.d.d;
    uVar9 = local_78._0_8_;
    QVar58.m_data = (storage_type *)0x11;
    QVar58.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar58);
    local_78.xo_value.d.size = (qsizetype)local_78.xo_text.d.ptr;
    local_78.xo_value.d.ptr = (char16_t *)local_78.xo_text.d.d;
    uVar10 = local_78._0_8_;
    local_78.xo_type = 8;
    local_78.xo_text.d.d = (Data *)uVar9;
    local_78.xo_text.d.ptr = (char16_t *)pDVar14;
    local_78.xo_text.d.size = (qsizetype)pcVar15;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.xo_value.d.d = (Data *)uVar10;
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
    local_b8.xo_type = 6;
    local_b8.xo_text.d.d = (Data *)0x0;
    local_b8.xo_text.d.ptr = (char16_t *)0x0;
    local_b8.xo_text.d.size = 0;
    local_b8.xo_value.d.d = (Data *)0x0;
    local_b8.xo_value.d.ptr = (char16_t *)0x0;
    local_b8.xo_value.d.size = 0;
    XmlOutput::operator<<(pXVar22,&local_b8);
    if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if (*(long *)((long)__buf + 0x100) != 0) {
      lVar27 = 0xc0;
      uVar28 = 0;
      do {
        QVar59.m_data = (storage_type *)0xb;
        QVar59.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar59);
        uVar8 = local_78._0_8_;
        local_208._0_4_ = tTag;
        local_208._8_8_ = local_78._0_8_;
        local_208._16_8_ = local_78.xo_text.d.d;
        local_208._24_8_ = local_78.xo_text.d.ptr;
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_208._32_8_ = (QArrayData *)0x0;
        local_208._40_8_ = (char16_t *)0x0;
        local_208._48_8_ = 0;
        pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
        QVar60.m_data = (storage_type *)0x9;
        QVar60.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar60);
        pcVar15 = local_78.xo_text.d.ptr;
        pDVar14 = local_78.xo_text.d.d;
        uVar9 = local_78._0_8_;
        generateCondition((QString *)&local_f0,
                          (VCConfiguration *)(*(long *)((long)__buf + 0xf8) + lVar27));
        local_78.xo_type = 8;
        local_78.xo_text.d.d = (Data *)uVar9;
        local_78.xo_text.d.ptr = (char16_t *)pDVar14;
        local_78.xo_text.d.size = (qsizetype)pcVar15;
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78.xo_value.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
        local_78.xo_value.d.ptr = (char16_t *)local_f0.xo_text.d.d;
        local_78.xo_value.d.size = (qsizetype)local_f0.xo_text.d.ptr;
        if ((QArrayData *)local_78.xo_value.d.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
        QVar61.m_data = (storage_type *)0x5;
        QVar61.m_size = (qsizetype)&local_b8;
        QString::fromUtf8(QVar61);
        pcVar15 = local_b8.xo_text.d.ptr;
        pDVar14 = local_b8.xo_text.d.d;
        uVar10 = local_b8._0_8_;
        QVar62.m_data = (storage_type *)0xe;
        QVar62.m_size = (qsizetype)&local_b8;
        QString::fromUtf8(QVar62);
        local_b8.xo_value.d.size = (qsizetype)local_b8.xo_text.d.ptr;
        local_b8.xo_value.d.ptr = (char16_t *)local_b8.xo_text.d.d;
        uVar11 = local_b8._0_8_;
        local_b8.xo_type = 8;
        local_b8.xo_text.d.d = (Data *)uVar10;
        local_b8.xo_text.d.ptr = (char16_t *)pDVar14;
        local_b8.xo_text.d.size = (qsizetype)pcVar15;
        if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_b8.xo_value.d.d = (Data *)uVar11;
        if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        XmlOutput::operator<<(pXVar22,&local_b8);
        if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
          }
        }
        if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
          }
        }
        if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar6 = (int *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_f0._4_4_,local_f0.xo_type),2,0x10);
          }
        }
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
          }
        }
        if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
          }
        }
        if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
          }
        }
        QVar63.m_data = (storage_type *)0x6;
        QVar63.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar63);
        uVar8 = local_78._0_8_;
        local_208._0_4_ = 3;
        local_208._8_8_ = local_78._0_8_;
        local_208._16_8_ = local_78.xo_text.d.d;
        local_208._24_8_ = local_78.xo_text.d.ptr;
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_208._32_8_ = (QArrayData *)0x0;
        local_208._40_8_ = (char16_t *)0x0;
        local_208._48_8_ = 0;
        pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
        QVar64.m_data = (storage_type *)0x7;
        QVar64.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar64);
        pcVar15 = local_78.xo_text.d.ptr;
        pDVar14 = local_78.xo_text.d.d;
        uVar9 = local_78._0_8_;
        QVar65.m_data = (storage_type *)0x33;
        QVar65.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar65);
        local_78.xo_value.d.size = (qsizetype)local_78.xo_text.d.ptr;
        local_78.xo_value.d.ptr = (char16_t *)local_78.xo_text.d.d;
        uVar10 = local_78._0_8_;
        local_78.xo_type = 8;
        local_78.xo_text.d.d = (Data *)uVar9;
        local_78.xo_text.d.ptr = (char16_t *)pDVar14;
        local_78.xo_text.d.size = (qsizetype)pcVar15;
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78.xo_value.d.d = (Data *)uVar10;
        if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
        QVar66.m_data = (storage_type *)0x9;
        QVar66.m_size = (qsizetype)&local_b8;
        QString::fromUtf8(QVar66);
        pcVar15 = local_b8.xo_text.d.ptr;
        pDVar14 = local_b8.xo_text.d.d;
        uVar11 = local_b8._0_8_;
        QVar67.m_data = (storage_type *)0x3d;
        QVar67.m_size = (qsizetype)&local_b8;
        QString::fromUtf8(QVar67);
        local_b8.xo_value.d.size = (qsizetype)local_b8.xo_text.d.ptr;
        local_b8.xo_value.d.ptr = (char16_t *)local_b8.xo_text.d.d;
        uVar17 = local_b8._0_8_;
        local_b8.xo_type = 8;
        local_b8.xo_text.d.d = (Data *)uVar11;
        local_b8.xo_text.d.ptr = (char16_t *)pDVar14;
        local_b8.xo_text.d.size = (qsizetype)pcVar15;
        if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_b8.xo_value.d.d = (Data *)uVar17;
        if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_b8);
        local_f0.xo_type = tCloseTag;
        local_f0.xo_value.d.ptr = (char16_t *)0x0;
        local_f0.xo_value.d.size = 0;
        local_f0.xo_text.d.size = 0;
        local_f0.xo_value.d.d = (Data *)0x0;
        local_f0.xo_text.d.d = (Data *)0x0;
        local_f0.xo_text.d.ptr = (char16_t *)0x0;
        pXVar22 = XmlOutput::operator<<(pXVar22,&local_f0);
        local_128.xo_type = 6;
        local_128.xo_value.d.ptr = (char16_t *)0x0;
        local_128.xo_value.d.size = 0;
        local_128.xo_text.d.size = 0;
        local_128.xo_value.d.d = (Data *)0x0;
        local_128.xo_text.d.d = (Data *)0x0;
        local_128.xo_text.d.ptr = (char16_t *)0x0;
        XmlOutput::operator<<(pXVar22,&local_128);
        if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar17,2,0x10);
          }
        }
        if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
          }
        }
        if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
          }
        }
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
          }
        }
        if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
          }
        }
        if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
          }
        }
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + 0x3a10;
      } while (uVar28 < *(ulong *)((long)__buf + 0x100));
    }
    QVar68.m_data = (storage_type *)0xd;
    QVar68.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar68);
    local_208._24_8_ = local_208._16_8_;
    local_208._16_8_ = local_208._8_8_;
    uVar8 = local_208._0_8_;
    local_208._0_4_ = 3;
    local_208._8_8_ = uVar8;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208._32_8_ = (QArrayData *)0x0;
    local_208._40_8_ = (char16_t *)0x0;
    local_208._48_8_ = 0;
    pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    QVar69.m_data = (storage_type *)0x5;
    QVar69.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar69);
    pcVar15 = local_78.xo_text.d.ptr;
    pDVar14 = local_78.xo_text.d.d;
    uVar9 = local_78._0_8_;
    QVar70.m_data = (storage_type *)0xa;
    QVar70.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar70);
    local_78.xo_value.d.size = (qsizetype)local_78.xo_text.d.ptr;
    local_78.xo_value.d.ptr = (char16_t *)local_78.xo_text.d.d;
    uVar10 = local_78._0_8_;
    local_78.xo_type = 8;
    local_78.xo_text.d.d = (Data *)uVar9;
    local_78.xo_text.d.ptr = (char16_t *)pDVar14;
    local_78.xo_text.d.size = (qsizetype)pcVar15;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.xo_value.d.d = (Data *)uVar10;
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
    local_b8.xo_type = 6;
    local_b8.xo_text.d.d = (Data *)0x0;
    local_b8.xo_text.d.ptr = (char16_t *)0x0;
    local_b8.xo_text.d.size = 0;
    local_b8.xo_value.d.d = (Data *)0x0;
    local_b8.xo_value.d.ptr = (char16_t *)0x0;
    local_b8.xo_value.d.size = 0;
    XmlOutput::operator<<(pXVar22,&local_b8);
    if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    QVar71.m_data = (storage_type *)0xd;
    QVar71.m_size = (qsizetype)local_208;
    QString::fromUtf8(QVar71);
    local_208._24_8_ = local_208._16_8_;
    local_208._16_8_ = local_208._8_8_;
    uVar8 = local_208._0_8_;
    local_208._0_4_ = tTag;
    local_208._8_8_ = uVar8;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208._32_8_ = (QArrayData *)0x0;
    local_208._40_8_ = (char16_t *)0x0;
    local_208._48_8_ = 0;
    XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if (*(long *)((long)__buf + 0x100) != 0) {
      uVar28 = 0;
      do {
        lVar27 = *(long *)((long)__buf + 0xf8) + uVar28 * 0x3a10;
        lVar3 = *(long *)((long)__buf + 0xf8) + uVar28 * 0x3a10;
        local_128.xo_text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128.xo_text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        generateCondition((QString *)&local_128,(VCConfiguration *)(lVar3 + 0xc0));
        if (*(long *)(lVar3 + 0x160) != 0) {
          QVar72.m_data = (storage_type *)0x6;
          QVar72.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar72);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar73.m_data = (storage_type *)0x9;
          QVar73.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar73);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          local_b8.xo_type = 5;
          local_b8.xo_text.d.d = *(Data **)(lVar27 + 0x150);
          local_b8.xo_text.d.ptr = *(char16_t **)(lVar27 + 0x158);
          local_b8.xo_text.d.size = *(undefined8 *)(lVar27 + 0x160);
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          local_b8.xo_value.d.d = (Data *)0x0;
          local_b8.xo_value.d.ptr = (char16_t *)0x0;
          local_b8.xo_value.d.size = 0;
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(long *)(lVar27 + 0x118) != 0) {
          QVar74.m_data = (storage_type *)0x6;
          QVar74.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar74);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar75.m_data = (storage_type *)0x9;
          QVar75.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar75);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          local_b8.xo_type = 5;
          local_b8.xo_text.d.d = *(Data **)(lVar27 + 0x108);
          local_b8.xo_text.d.ptr = *(char16_t **)(lVar27 + 0x110);
          local_b8.xo_text.d.size = *(undefined8 *)(lVar27 + 0x118);
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          local_b8.xo_value.d.d = (Data *)0x0;
          local_b8.xo_value.d.ptr = (char16_t *)0x0;
          local_b8.xo_value.d.size = 0;
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(long *)(lVar27 + 0x178) != 0) {
          QVar76.m_data = (storage_type *)0xa;
          QVar76.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar76);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar77.m_data = (storage_type *)0x9;
          QVar77.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar77);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          local_b8.xo_type = 5;
          local_b8.xo_text.d.d = *(Data **)(lVar27 + 0x168);
          local_b8.xo_text.d.ptr = *(char16_t **)(lVar27 + 0x170);
          local_b8.xo_text.d.size = *(undefined8 *)(lVar27 + 0x178);
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          local_b8.xo_value.d.d = (Data *)0x0;
          local_b8.xo_value.d.ptr = (char16_t *)0x0;
          local_b8.xo_value.d.size = 0;
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(long *)(lVar27 + 400) != 0) {
          QVar78.m_data = (storage_type *)0x9;
          QVar78.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar78);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar79.m_data = (storage_type *)0x9;
          QVar79.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar79);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          local_b8.xo_type = 5;
          local_b8.xo_text.d.d = *(Data **)(lVar27 + 0x180);
          local_b8.xo_text.d.ptr = *(char16_t **)(lVar27 + 0x188);
          local_b8.xo_text.d.size = *(undefined8 *)(lVar27 + 400);
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          local_b8.xo_value.d.d = (Data *)0x0;
          local_b8.xo_value.d.ptr = (char16_t *)0x0;
          local_b8.xo_value.d.size = 0;
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(int *)(lVar27 + 0x62c) != -1) {
          QVar80.m_data = (storage_type *)0x13;
          QVar80.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar80);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar81.m_data = (storage_type *)0x9;
          QVar81.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar81);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          if (*(int *)(lVar27 + 0x62c) == -1) {
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
            local_b8.xo_text.d.size = 0;
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_text.d.d = (Data *)0x0;
            local_b8.xo_text.d.ptr = (char16_t *)0x0;
          }
          else {
            pcVar25 = "false";
            if (*(int *)(lVar27 + 0x62c) == 1) {
              pcVar25 = "true";
            }
            psVar26 = (storage_type *)0xffffffffffffffff;
            do {
              pcVar1 = psVar26 + (long)(pcVar25 + 1);
              psVar26 = psVar26 + 1;
            } while (*pcVar1 != '\0');
            QVar82.m_data = psVar26;
            QVar82.m_size = (qsizetype)&local_f0;
            QString::fromUtf8(QVar82);
            local_b8.xo_text.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
            local_b8.xo_type = 5;
            local_b8.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
            local_b8.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
            if ((QArrayData *)local_b8.xo_text.d.d == (QArrayData *)0x0) {
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
            }
            else {
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + 1;
              UNLOCK();
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_b8.xo_text.d.d,2,0x10);
              }
            }
          }
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        iVar2 = *(int *)(lVar27 + 0x658);
        if (iVar2 != 0) {
          QVar83.m_data = (storage_type *)0xf;
          QVar83.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar83);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar84.m_data = (storage_type *)0x9;
          QVar84.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar84);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          pcVar25 = "false";
          if (iVar2 == 2) {
            pcVar25 = "true";
          }
          psVar26 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar26 + (long)(pcVar25 + 1);
            psVar26 = psVar26 + 1;
          } while (*pcVar1 != '\0');
          QVar85.m_data = psVar26;
          QVar85.m_size = (qsizetype)&local_f0;
          QString::fromUtf8(QVar85);
          local_b8.xo_text.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
          local_b8.xo_type = 5;
          local_b8.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
          local_b8.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
          if ((QArrayData *)local_b8.xo_text.d.d == (QArrayData *)0x0) {
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
          }
          else {
            LOCK();
            (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
                 + 1;
            UNLOCK();
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
            LOCK();
            (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_b8.xo_text.d.d,2,0x10);
            }
          }
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        iVar2 = *(int *)(lVar27 + 0x7d8);
        if (iVar2 != -1) {
          QVar86.m_data = (storage_type *)0x10;
          QVar86.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar86);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar87.m_data = (storage_type *)0x9;
          QVar87.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar87);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          pcVar25 = "false";
          if (iVar2 == 1) {
            pcVar25 = "true";
          }
          psVar26 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar26 + (long)(pcVar25 + 1);
            psVar26 = psVar26 + 1;
          } while (*pcVar1 != '\0');
          QVar88.m_data = psVar26;
          QVar88.m_size = (qsizetype)&local_f0;
          QString::fromUtf8(QVar88);
          local_b8.xo_text.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
          local_b8.xo_type = 5;
          local_b8.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
          local_b8.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
          if ((QArrayData *)local_b8.xo_text.d.d == (QArrayData *)0x0) {
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
          }
          else {
            LOCK();
            (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
                 + 1;
            UNLOCK();
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
            LOCK();
            (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_b8.xo_text.d.d,2,0x10);
            }
          }
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(int *)(lVar27 + 0xcf8) != -1) {
          QVar89.m_data = (storage_type *)0x17;
          QVar89.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar89);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar90.m_data = (storage_type *)0x9;
          QVar90.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar90);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          tVar21 = operator!((triState *)(lVar27 + 0xcf8));
          if (tVar21 == unset) {
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
            local_b8.xo_text.d.size = 0;
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_text.d.d = (Data *)0x0;
            local_b8.xo_text.d.ptr = (char16_t *)0x0;
          }
          else {
            pcVar25 = "false";
            if (tVar21 == _True) {
              pcVar25 = "true";
            }
            psVar26 = (storage_type *)0xffffffffffffffff;
            do {
              pcVar1 = psVar26 + (long)(pcVar25 + 1);
              psVar26 = psVar26 + 1;
            } while (*pcVar1 != '\0');
            QVar91.m_data = psVar26;
            QVar91.m_size = (qsizetype)&local_f0;
            QString::fromUtf8(QVar91);
            local_b8.xo_text.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
            local_b8.xo_type = 5;
            local_b8.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
            local_b8.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
            if ((QArrayData *)local_b8.xo_text.d.d == (QArrayData *)0x0) {
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
            }
            else {
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + 1;
              UNLOCK();
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_b8.xo_text.d.d,2,0x10);
              }
            }
          }
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(int *)(lVar27 + 0xdd0) != -1) {
          QVar92.m_data = (storage_type *)0x16;
          QVar92.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar92);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar93.m_data = (storage_type *)0x9;
          QVar93.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar93);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          tVar21 = operator!((triState *)(lVar27 + 0xdd0));
          if (tVar21 == unset) {
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
            local_b8.xo_text.d.size = 0;
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_text.d.d = (Data *)0x0;
            local_b8.xo_text.d.ptr = (char16_t *)0x0;
          }
          else {
            pcVar25 = "false";
            if (tVar21 == _True) {
              pcVar25 = "true";
            }
            psVar26 = (storage_type *)0xffffffffffffffff;
            do {
              pcVar1 = psVar26 + (long)(pcVar25 + 1);
              psVar26 = psVar26 + 1;
            } while (*pcVar1 != '\0');
            QVar94.m_data = psVar26;
            QVar94.m_size = (qsizetype)&local_f0;
            QString::fromUtf8(QVar94);
            local_b8.xo_text.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
            local_b8.xo_type = 5;
            local_b8.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
            local_b8.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
            if ((QArrayData *)local_b8.xo_text.d.d == (QArrayData *)0x0) {
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
            }
            else {
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + 1;
              UNLOCK();
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_b8.xo_text.d.d,2,0x10);
              }
            }
          }
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if (*(int *)(lVar27 + 0xc70) != -1) {
          QVar95.m_data = (storage_type *)0x18;
          QVar95.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar95);
          uVar8 = local_78._0_8_;
          local_208._0_4_ = tTag;
          local_208._8_8_ = local_78._0_8_;
          local_208._16_8_ = local_78.xo_text.d.d;
          local_208._24_8_ = local_78.xo_text.d.ptr;
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_208._32_8_ = (QArrayData *)0x0;
          local_208._40_8_ = (char16_t *)0x0;
          local_208._48_8_ = 0;
          pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
          QVar96.m_data = (storage_type *)0x9;
          QVar96.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar96);
          local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
          local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
          uVar9 = local_78._0_8_;
          local_78.xo_type = 8;
          local_78.xo_text.d.d = (Data *)uVar9;
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_78.xo_value.d.d = (Data *)local_128._0_8_;
          local_78.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
          local_78.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar22 = XmlOutput::operator<<(pXVar22,&local_78);
          tVar21 = operator!((triState *)(lVar27 + 0xc70));
          if (tVar21 == unset) {
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
            local_b8.xo_value.d.ptr = (char16_t *)0x0;
            local_b8.xo_value.d.size = 0;
            local_b8.xo_text.d.size = 0;
            local_b8.xo_value.d.d = (Data *)0x0;
            local_b8.xo_text.d.d = (Data *)0x0;
            local_b8.xo_text.d.ptr = (char16_t *)0x0;
          }
          else {
            pcVar25 = "false";
            if (tVar21 == _True) {
              pcVar25 = "true";
            }
            psVar26 = (storage_type *)0xffffffffffffffff;
            do {
              pcVar1 = psVar26 + (long)(pcVar25 + 1);
              psVar26 = psVar26 + 1;
            } while (*pcVar1 != '\0');
            QVar97.m_data = psVar26;
            QVar97.m_size = (qsizetype)&local_f0;
            QString::fromUtf8(QVar97);
            local_b8.xo_text.d.d = (Data *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
            local_b8.xo_type = 5;
            local_b8.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
            local_b8.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
            if ((QArrayData *)local_b8.xo_text.d.d == (QArrayData *)0x0) {
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
            }
            else {
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + 1;
              UNLOCK();
              local_b8.xo_value.d.d = (Data *)0x0;
              local_b8.xo_value.d.ptr = (char16_t *)0x0;
              local_b8.xo_value.d.size = 0;
              LOCK();
              (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QArrayData *)local_b8.xo_text.d.d)->ref_)._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_b8.xo_text.d.d,2,0x10);
              }
            }
          }
          XmlOutput::operator<<(pXVar22,&local_b8);
          if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
            }
          }
          if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
            }
          }
        }
        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < *(ulong *)((long)__buf + 0x100));
    }
    local_208._0_4_ = 6;
    local_208._8_8_ = (QArrayData *)0x0;
    local_208._16_8_ = (QArrayData *)0x0;
    local_208._24_8_ = (undefined1 *)0x0;
    local_208._32_8_ = (QArrayData *)0x0;
    local_208._40_8_ = (char16_t *)0x0;
    local_208._48_8_ = (undefined1 *)0x0;
    XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
    if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
      }
    }
    if (*(long *)((long)__buf + 0x100) != 0) {
      lVar27 = 0;
      uVar28 = 0;
      do {
        lVar3 = *(long *)((long)__buf + 0xf8);
        QVar98.m_data = (storage_type *)0x13;
        QVar98.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar98);
        uVar8 = local_78._0_8_;
        local_208._0_4_ = tTag;
        local_208._8_8_ = local_78._0_8_;
        local_208._16_8_ = local_78.xo_text.d.d;
        local_208._24_8_ = local_78.xo_text.d.ptr;
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_208._32_8_ = (QArrayData *)0x0;
        local_208._40_8_ = (char16_t *)0x0;
        local_208._48_8_ = 0;
        pXVar22 = XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
        QVar99.m_data = (storage_type *)0x9;
        QVar99.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar99);
        pcVar15 = local_78.xo_text.d.ptr;
        pDVar14 = local_78.xo_text.d.d;
        uVar9 = local_78._0_8_;
        generateCondition((QString *)&local_b8,(VCConfiguration *)(lVar27 + lVar3 + 0xc0));
        local_78.xo_type = 8;
        local_78.xo_text.d.d = (Data *)uVar9;
        local_78.xo_text.d.ptr = (char16_t *)pDVar14;
        local_78.xo_text.d.size = (qsizetype)pcVar15;
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78.xo_value.d.d = (Data *)local_b8._0_8_;
        local_78.xo_value.d.ptr = (char16_t *)local_b8.xo_text.d.d;
        local_78.xo_value.d.size = (qsizetype)local_b8.xo_text.d.ptr;
        if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        XmlOutput::operator<<(pXVar22,&local_78);
        if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
          }
        }
        if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
          }
        }
        if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
          }
        }
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[4])
                  (this,pXVar24,lVar27 + lVar3 + 0x1d8);
        pp_Var4 = (this->super_VCProjectWriter)._vptr_VCProjectWriter;
        if (*(int *)(lVar27 + lVar3 + 0xd4) == 4) {
          (*pp_Var4[9])(this,pXVar24,lVar27 + lVar3 + 0x928);
        }
        else {
          (*pp_Var4[5])(this,pXVar24,lVar27 + lVar3 + 0x4f8);
        }
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[7])
                  (this,pXVar24,lVar27 + lVar3 + 0xa10);
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[10])
                  (this,pXVar24,lVar27 + lVar3 + 0xe20);
        if (*(int *)(lVar27 + lVar3 + 0xc70) != -1) {
          (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                    (this,pXVar24,lVar27 + lVar3 + 0xc38);
        }
        if (*(int *)(lVar3 + 0xcf8 + lVar27) != -1) {
          (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                    (this,pXVar24,lVar27 + lVar3 + 0xcc0);
        }
        if (*(int *)(lVar3 + 0xdd0 + lVar27) != -1) {
          (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                    (this,pXVar24,lVar27 + lVar3 + 0xd98);
        }
        local_208._0_4_ = 6;
        local_208._40_8_ = (char16_t *)0x0;
        local_208._48_8_ = (undefined1 *)0x0;
        local_208._24_8_ = (undefined1 *)0x0;
        local_208._32_8_ = (QArrayData *)0x0;
        local_208._8_8_ = (QArrayData *)0x0;
        local_208._16_8_ = (QArrayData *)0x0;
        XmlOutput::operator<<(pXVar24,(xml_output *)local_208);
        if ((QArrayData *)local_208._32_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._32_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_208._32_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_208._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_208._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_208._8_8_,2,0x10);
          }
        }
        if (*(char *)(lVar3 + 0xf10 + lVar27) == '\0') {
          (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xd])
                    (this,pXVar24,lVar27 + lVar3 + 0xed8);
        }
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + 0x3a10;
      } while (uVar28 < *(ulong *)((long)__buf + 0x100));
    }
    local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_168.xo_text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_168);
    QFile::fileName();
    QString::append(local_208,".filters",8);
    QFile::setFileName((QString *)&local_168);
    if ((QArrayData *)local_208._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._0_8_,2,0x10);
      }
    }
    cVar20 = QFile::open(&local_168,0x1a);
    if (cVar20 == '\0') {
      warn_msg(WarnLogic,"Cannot open output filter file");
    }
    else {
      local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1a8.xo_text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_1a8,(QIODevice *)&local_168);
      local_1b8 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
      pDStack_1c0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_208._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_208._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      XmlOutput::XmlOutput((XmlOutput *)local_208,(QTextStream *)&local_1a8,NoConversion);
      QVar100.m_data = (storage_type *)0x2;
      QVar100.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar100);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      XmlOutput::setIndentString((XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar101.m_data = (storage_type *)0x3;
      QVar101.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar101);
      pcVar15 = local_78.xo_text.d.ptr;
      pDVar14 = local_78.xo_text.d.d;
      uVar8 = local_78._0_8_;
      QVar102.m_data = (storage_type *)0x5;
      QVar102.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar102);
      local_78.xo_value.d.size = (qsizetype)local_78.xo_text.d.ptr;
      local_78.xo_value.d.ptr = (char16_t *)local_78.xo_text.d.d;
      uVar9 = local_78._0_8_;
      local_78.xo_type = 2;
      local_78.xo_text.d.d = (Data *)uVar8;
      local_78.xo_text.d.ptr = (char16_t *)pDVar14;
      local_78.xo_text.d.size = (qsizetype)pcVar15;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_78.xo_value.d.d = (Data *)uVar9;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar22 = XmlOutput::operator<<((XmlOutput *)local_208,&local_78);
      QVar103.m_data = (storage_type *)0x7;
      QVar103.m_size = (qsizetype)&local_b8;
      QString::fromUtf8(QVar103);
      local_b8.xo_text.d.size = (qsizetype)local_b8.xo_text.d.ptr;
      local_b8.xo_text.d.ptr = (char16_t *)local_b8.xo_text.d.d;
      uVar10 = local_b8._0_8_;
      local_b8.xo_type = tTag;
      local_b8.xo_text.d.d = (Data *)uVar10;
      if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b8.xo_value.d.d = (Data *)0x0;
      local_b8.xo_value.d.ptr = (char16_t *)0x0;
      local_b8.xo_value.d.size = 0;
      pXVar22 = XmlOutput::operator<<(pXVar22,&local_b8);
      iVar23 = QList<VCProjectSingleConfig>::begin
                         ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0));
      attrTagToolsVersion(&local_f0,&(iVar23.i)->Configuration);
      pXVar22 = XmlOutput::operator<<(pXVar22,&local_f0);
      QVar104.m_data = (storage_type *)0x5;
      QVar104.m_size = (qsizetype)&local_128;
      QString::fromUtf8(QVar104);
      pcVar15 = local_128.xo_text.d.ptr;
      pDVar14 = local_128.xo_text.d.d;
      uVar11 = local_128._0_8_;
      QVar105.m_data = (storage_type *)0x33;
      QVar105.m_size = (qsizetype)&local_128;
      QString::fromUtf8(QVar105);
      local_128.xo_value.d.size = (qsizetype)local_128.xo_text.d.ptr;
      local_128.xo_value.d.ptr = (char16_t *)local_128.xo_text.d.d;
      uVar17 = local_128._0_8_;
      local_128.xo_type = tAttributeTag;
      local_128.xo_text.d.d = (Data *)uVar11;
      local_128.xo_text.d.ptr = (char16_t *)pDVar14;
      local_128.xo_text.d.size = (qsizetype)pcVar15;
      if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_128.xo_value.d.d = (Data *)uVar17;
      if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      XmlOutput::operator<<(pXVar22,&local_128);
      if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar17,2,0x10);
        }
      }
      if ((QArrayData *)uVar11 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar11)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
        }
      }
      if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
        }
      }
      if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      QVar106.m_data = (storage_type *)0x9;
      QVar106.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar106);
      local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
      local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
      uVar8 = local_78._0_8_;
      local_78.xo_type = 3;
      local_78.xo_text.d.d = (Data *)uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_78.xo_value.d.d = (Data *)0x0;
      local_78.xo_value.d.ptr = (char16_t *)0x0;
      local_78.xo_value.d.size = 0;
      XmlOutput::operator<<((XmlOutput *)local_208,&local_78);
      if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      QVar107.m_data = (storage_type *)0xa;
      QVar107.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar107);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar108.m_data = (storage_type *)0xf;
      QVar108.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar108);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar109.m_data = &DAT_0000000c;
      QVar109.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar109);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar110.m_data = (storage_type *)0xd;
      QVar110.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar110);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar111.m_data = (storage_type *)0xe;
      QVar111.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar111);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar112.m_data = &DAT_0000000c;
      QVar112.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar112);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar113.m_data = (storage_type *)0x11;
      QVar113.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar113);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar114.m_data = (storage_type *)0x10;
      QVar114.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar114);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar115.m_data = (storage_type *)0x12;
      QVar115.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar115);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      addFilters((VCProject *)__buf,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if (*(long *)((long)__buf + 0x118) != 0) {
        lVar27 = 0;
        uVar28 = 0;
        do {
          addFilters((VCProject *)__buf,(XmlOutput *)local_208,
                     (QString *)(*(long *)((long)__buf + 0x110) + lVar27));
          uVar28 = uVar28 + 1;
          lVar27 = lVar27 + 0x18;
        } while (uVar28 < *(ulong *)((long)__buf + 0x118));
      }
      local_78.xo_type = 6;
      local_78.xo_text.d.d = (Data *)0x0;
      local_78.xo_text.d.ptr = (char16_t *)0x0;
      local_78.xo_text.d.size = 0;
      local_78.xo_value.d.d = (Data *)0x0;
      local_78.xo_value.d.ptr = (char16_t *)0x0;
      local_78.xo_value.d.size = 0;
      XmlOutput::operator<<((XmlOutput *)local_208,&local_78);
      if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVar116.m_data = &DAT_0000000c;
      QVar116.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar116);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar117.m_data = &DAT_0000000c;
      QVar117.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar117);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar118.m_data = (storage_type *)0xf;
      QVar118.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar118);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar119.m_data = (storage_type *)0xd;
      QVar119.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar119);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar120.m_data = (storage_type *)0x11;
      QVar120.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar120);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar121.m_data = (storage_type *)0xa;
      QVar121.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar121);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar122.m_data = (storage_type *)0xe;
      QVar122.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar122);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar123.m_data = (storage_type *)0x10;
      QVar123.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar123);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar124.m_data = (storage_type *)0x12;
      QVar124.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar124);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if (*(long *)((long)__buf + 0x118) != 0) {
        lVar27 = 0;
        uVar28 = 0;
        do {
          outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,
                       (QString *)(*(long *)((long)__buf + 0x110) + lVar27));
          uVar28 = uVar28 + 1;
          lVar27 = lVar27 + 0x18;
        } while (uVar28 < *(ulong *)((long)__buf + 0x118));
      }
      QVar125.m_data = (storage_type *)0xa;
      QVar125.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar125);
      local_b8.xo_type = local_78.xo_type;
      local_b8._4_4_ = local_78._4_4_;
      local_b8.xo_text.d.d = local_78.xo_text.d.d;
      local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
      outputFilter((VCProject *)__buf,pXVar24,(XmlOutput *)local_208,(QString *)&local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      QVar126.m_data = (storage_type *)0x7;
      QVar126.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar126);
      pcVar15 = local_78.xo_text.d.ptr;
      pDVar14 = local_78.xo_text.d.d;
      uVar8 = local_78._0_8_;
      QVar127.m_data = (storage_type *)0x26;
      QVar127.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar127);
      local_78.xo_value.d.size = (qsizetype)local_78.xo_text.d.ptr;
      local_78.xo_value.d.ptr = (char16_t *)local_78.xo_text.d.d;
      uVar9 = local_78._0_8_;
      local_78.xo_type = 10;
      local_78.xo_text.d.d = (Data *)uVar8;
      local_78.xo_text.d.ptr = (char16_t *)pDVar14;
      local_78.xo_text.d.size = (qsizetype)pcVar15;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_78.xo_value.d.d = (Data *)uVar9;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar24 = XmlOutput::operator<<(pXVar24,&local_78);
      QVar128.m_data = (storage_type *)0xb;
      QVar128.m_size = (qsizetype)&local_b8;
      QString::fromUtf8(QVar128);
      local_b8.xo_text.d.size = (qsizetype)local_b8.xo_text.d.ptr;
      local_b8.xo_text.d.ptr = (char16_t *)local_b8.xo_text.d.d;
      uVar10 = local_b8._0_8_;
      local_b8.xo_type = 3;
      local_b8.xo_text.d.d = (Data *)uVar10;
      if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b8.xo_value.d.d = (Data *)0x0;
      local_b8.xo_value.d.ptr = (char16_t *)0x0;
      local_b8.xo_value.d.size = 0;
      pXVar24 = XmlOutput::operator<<(pXVar24,&local_b8);
      QVar129.m_data = (storage_type *)0x5;
      QVar129.m_size = (qsizetype)&local_f0;
      QString::fromUtf8(QVar129);
      pcVar15 = local_f0.xo_text.d.ptr;
      pDVar14 = local_f0.xo_text.d.d;
      pQVar5 = (QArrayData *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
      QVar130.m_data = (storage_type *)0x10;
      QVar130.m_size = (qsizetype)&local_f0;
      QString::fromUtf8(QVar130);
      local_f0.xo_value.d.size = (qsizetype)local_f0.xo_text.d.ptr;
      pQVar7 = (QArrayData *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
      local_f0.xo_type = tAttributeTag;
      local_f0.xo_text.d.ptr = (char16_t *)pDVar14;
      local_f0.xo_text.d.size = (qsizetype)pcVar15;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_f0.xo_value.d.ptr = (char16_t *)local_f0.xo_text.d.d;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_f0.xo_text.d.d = (Data *)pQVar5;
      local_f0.xo_value.d.d = (Data *)pQVar7;
      pXVar24 = XmlOutput::operator<<(pXVar24,&local_f0);
      local_128.xo_type = 6;
      local_128.xo_text.d.d = (Data *)0x0;
      local_128.xo_text.d.ptr = (char16_t *)0x0;
      local_128.xo_text.d.size = 0;
      local_128.xo_value.d.d = (Data *)0x0;
      local_128.xo_value.d.ptr = (char16_t *)0x0;
      local_128.xo_value.d.size = 0;
      XmlOutput::operator<<(pXVar24,&local_128);
      if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
        }
      }
      if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      XmlOutput::~XmlOutput((XmlOutput *)local_208);
      QTextStream::~QTextStream((QTextStream *)&local_1a8);
    }
    QFile::~QFile((QFile *)&local_168);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, VCProject &tool)
{
    if (tool.SingleProjects.size() == 0) {
        warn_msg(WarnLogic, "Generator: .NET: no single project in merge project, no output");
        return;
    }

    xml.setIndentString("  ");

    xml << decl("1.0", "utf-8")
        << tag("Project")
        << attrTag("DefaultTargets","Build")
        << attrTagToolsVersion(tool.SingleProjects.first().Configuration)
        << attrTag("xmlns", "http://schemas.microsoft.com/developer/msbuild/2003")
        << tag("ItemGroup")
        << attrTag("Label", "ProjectConfigurations");

    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        xml << tag("ProjectConfiguration")
            << attrTag("Include" , tool.SingleProjects.at(i).Configuration.Name)
            << tagValue("Configuration", tool.SingleProjects.at(i).Configuration.ConfigurationName)
            << tagValue("Platform", tool.SingleProjects.at(i).PlatformName)
            << closetag();
    }

    xml << closetag()
        << tag("PropertyGroup")
        << attrTag("Label", "Globals")
        << tagValue("ProjectGuid", tool.ProjectGUID)
        << tagValue("RootNamespace", tool.Name)
        << tagValue("Keyword", tool.Keyword);

    if (!tool.WindowsTargetPlatformVersion.isEmpty())
        xml << tagValue("WindowsTargetPlatformVersion", tool.WindowsTargetPlatformVersion);
    if (!tool.WindowsTargetPlatformMinVersion.isEmpty())
        xml << tagValue("WindowsTargetPlatformMinVersion", tool.WindowsTargetPlatformMinVersion);

    xml << closetag();

    // config part.
    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.Default.props");
    for (int i = 0; i < tool.SingleProjects.size(); ++i)
        write(xml, tool.SingleProjects.at(i).Configuration);
    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.props");

    // Extension settings
    xml << tag("ImportGroup")
        << attrTag("Label", "ExtensionSettings")
        << closetag();

    // PropertySheets
    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        xml << tag("ImportGroup")
            << attrTag("Condition", generateCondition(tool.SingleProjects.at(i).Configuration))
            << attrTag("Label", "PropertySheets");

        xml << tag("Import")
            << attrTag("Project", "$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props")
            << attrTag("Condition", "exists('$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props')")
            << closetag()
            << closetag();
    }

    // UserMacros
    xml << tag("PropertyGroup")
        << attrTag("Label", "UserMacros")
        << closetag();

    xml << tag("PropertyGroup");
    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        const VCConfiguration &config = tool.SingleProjects.at(i).Configuration;
        const QString condition = generateCondition(config);

        if (!config.OutputDirectory.isEmpty()) {
            xml << tag("OutDir")
                << attrTag("Condition", condition)
                << valueTag(config.OutputDirectory);
        }
        if (!config.IntermediateDirectory.isEmpty()) {
            xml << tag("IntDir")
                << attrTag("Condition", condition)
                << valueTag(config.IntermediateDirectory);
        }
        if (!config.PrimaryOutput.isEmpty()) {
            xml << tag("TargetName")
                << attrTag("Condition", condition)
                << valueTag(config.PrimaryOutput);
        }
        if (!config.PrimaryOutputExtension.isEmpty()) {
            xml << tag("TargetExt")
                << attrTag("Condition", condition)
                << valueTag(config.PrimaryOutputExtension);
        }
        if (config.linker.IgnoreImportLibrary != unset) {
            xml << tag("IgnoreImportLibrary")
                << attrTag("Condition", condition)
                << valueTagT(config.linker.IgnoreImportLibrary);
        }

        if (config.linker.LinkIncremental != linkIncrementalDefault) {
            const triState ts = (config.linker.LinkIncremental == linkIncrementalYes ? _True : _False);
            xml << tag("LinkIncremental")
                << attrTag("Condition", condition)
                << valueTagT(ts);
        }

        const triState generateManifest = config.linker.GenerateManifest;
        if (generateManifest != unset) {
            xml << tag("GenerateManifest")
                << attrTag("Condition", condition)
                << valueTagT(generateManifest);
        }

        if (config.preBuild.ExcludedFromBuild != unset)
        {
            xml << tag("PreBuildEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.preBuild.ExcludedFromBuild);
        }

        if (config.preLink.ExcludedFromBuild != unset)
        {
            xml << tag("PreLinkEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.preLink.ExcludedFromBuild);
        }

        if (config.postBuild.ExcludedFromBuild != unset)
        {
            xml << tag("PostBuildEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.postBuild.ExcludedFromBuild);
        }
    }
    xml << closetag();

    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        const VCConfiguration &config = tool.SingleProjects.at(i).Configuration;

        xml << tag("ItemDefinitionGroup")
            << attrTag("Condition", generateCondition(config));

        // ClCompile
        write(xml, config.compiler);

        // Librarian / Linker
        if (config.ConfigurationType == typeStaticLibrary)
            write(xml, config.librarian);
        else
            write(xml, config.linker);

        // Midl
        write(xml, config.idl);

        // ResourceCompiler
        write(xml, config.resource);

        // Post build event
        if (config.postBuild.ExcludedFromBuild != unset)
            write(xml, config.postBuild);

        // Pre build event
        if (config.preBuild.ExcludedFromBuild != unset)
            write(xml, config.preBuild);

        // Pre link event
        if (config.preLink.ExcludedFromBuild != unset)
            write(xml, config.preLink);

        xml << closetag();

        // windeployqt
        if (!config.windeployqt.ExcludedFromBuild)
            write(xml, config.windeployqt);
    }

    // The file filters are added in a separate file for MSBUILD.
    QFile filterFile;
    filterFile.setFileName(Option::output.fileName().append(".filters"));
    if (!filterFile.open(QIODevice::WriteOnly | QIODevice::Text | QIODevice::Truncate)) {
        warn_msg(WarnLogic, "Cannot open output filter file");
        return;
    }
    QTextStream ts(&filterFile);
    XmlOutput xmlFilter(ts, XmlOutput::NoConversion);

    xmlFilter.setIndentString("  ");

    xmlFilter << decl("1.0", "utf-8")
              << tag("Project")
              << attrTagToolsVersion(tool.SingleProjects.first().Configuration)
              << attrTag("xmlns", "http://schemas.microsoft.com/developer/msbuild/2003");

    xmlFilter << tag("ItemGroup");

    addFilters(tool, xmlFilter, "Form Files");
    addFilters(tool, xmlFilter, "Generated Files");
    addFilters(tool, xmlFilter, "Header Files");
    addFilters(tool, xmlFilter, "LexYacc Files");
    addFilters(tool, xmlFilter, "Resource Files");
    addFilters(tool, xmlFilter, "Source Files");
    addFilters(tool, xmlFilter, "Translation Files");
    addFilters(tool, xmlFilter, "Deployment Files");
    addFilters(tool, xmlFilter, "Distribution Files");

    for (int x = 0; x < tool.ExtraCompilers.size(); ++x)
        addFilters(tool, xmlFilter, tool.ExtraCompilers.at(x));

    xmlFilter << closetag();

    outputFilter(tool, xml, xmlFilter, "Source Files");
    outputFilter(tool, xml, xmlFilter, "Header Files");
    outputFilter(tool, xml, xmlFilter, "Generated Files");
    outputFilter(tool, xml, xmlFilter, "LexYacc Files");
    outputFilter(tool, xml, xmlFilter, "Translation Files");
    outputFilter(tool, xml, xmlFilter, "Form Files");
    outputFilter(tool, xml, xmlFilter, "Resource Files");
    outputFilter(tool, xml, xmlFilter, "Deployment Files");
    outputFilter(tool, xml, xmlFilter, "Distribution Files");
    for (int x = 0; x < tool.ExtraCompilers.size(); ++x) {
        outputFilter(tool, xml, xmlFilter, tool.ExtraCompilers.at(x));
    }
    outputFilter(tool, xml, xmlFilter, "Root Files");

    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.targets")
        << tag("ImportGroup")
        << attrTag("Label", "ExtensionTargets")
        << closetag();
}